

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O3

void __thiscall
InitSocket::NotifyOnAddressChanges
          (InitSocket *this,
          vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
          *vNewListing)

{
  mutex *__mutex;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
  *ptVar1;
  _Tuple_impl<1UL,_int,_int> *p_Var2;
  bool bVar3;
  int iVar4;
  long lVar5;
  iterator __position;
  _Tuple_impl<1UL,_int,_int> *p_Var6;
  __normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>_>
  __position_00;
  pointer ptVar7;
  __normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>_>
  __it;
  function<void_(bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>
  *this_00;
  long lVar8;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>
  iter;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  vDelIPAddr;
  undefined1 local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  *local_70;
  InitSocket *local_68;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  *local_60;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  local_58;
  pthread_mutex_t *local_38;
  
  local_58.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __mutex = &this->m_mxCurIpAddr;
  local_70 = vNewListing;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  local_60 = &this->m_vCurIPAddr;
  __position._M_current =
       (this->m_vCurIPAddr).
       super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_68 = this;
  local_38 = (pthread_mutex_t *)__mutex;
  if (__position._M_current !=
      (this->m_vCurIPAddr).
      super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      __it._M_current =
           (local_70->
           super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      ptVar1 = (local_70->
               super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      lVar5 = (long)ptVar1 - (long)__it._M_current;
      lVar8 = (lVar5 >> 3) * -0x3333333333333333 >> 2;
      if (0 < lVar8) {
        ptVar7 = __it._M_current + lVar8 * 4;
        lVar8 = lVar8 + 1;
        do {
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<InitSocket::NotifyOnAddressChanges(std::vector<std::tuple<std::__cxx11::string,int,int>,std::allocator<std::tuple<std::__cxx11::string,int,int>>>&)::$_0>
                  ::operator()((_Iter_pred<InitSocket::NotifyOnAddressChanges(std::vector<std::tuple<std::__cxx11::string,int,int>,std::allocator<std::tuple<std::__cxx11::string,int,int>>>&)::__0>
                                *)__position._M_current,__it);
          __position_00._M_current = __it._M_current;
          if (bVar3) goto LAB_00116462;
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<InitSocket::NotifyOnAddressChanges(std::vector<std::tuple<std::__cxx11::string,int,int>,std::allocator<std::tuple<std::__cxx11::string,int,int>>>&)::$_0>
                  ::operator()((_Iter_pred<InitSocket::NotifyOnAddressChanges(std::vector<std::tuple<std::__cxx11::string,int,int>,std::allocator<std::tuple<std::__cxx11::string,int,int>>>&)::__0>
                                *)__position._M_current,__it._M_current + 1);
          __position_00._M_current = __it._M_current + 1;
          if (bVar3) goto LAB_00116462;
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<InitSocket::NotifyOnAddressChanges(std::vector<std::tuple<std::__cxx11::string,int,int>,std::allocator<std::tuple<std::__cxx11::string,int,int>>>&)::$_0>
                  ::operator()((_Iter_pred<InitSocket::NotifyOnAddressChanges(std::vector<std::tuple<std::__cxx11::string,int,int>,std::allocator<std::tuple<std::__cxx11::string,int,int>>>&)::__0>
                                *)__position._M_current,__it._M_current + 2);
          __position_00._M_current = __it._M_current + 2;
          if (bVar3) goto LAB_00116462;
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<InitSocket::NotifyOnAddressChanges(std::vector<std::tuple<std::__cxx11::string,int,int>,std::allocator<std::tuple<std::__cxx11::string,int,int>>>&)::$_0>
                  ::operator()((_Iter_pred<InitSocket::NotifyOnAddressChanges(std::vector<std::tuple<std::__cxx11::string,int,int>,std::allocator<std::tuple<std::__cxx11::string,int,int>>>&)::__0>
                                *)__position._M_current,__it._M_current + 3);
          __position_00._M_current = __it._M_current + 3;
          if (bVar3) goto LAB_00116462;
          __it._M_current = __it._M_current + 4;
          lVar8 = lVar8 + -1;
        } while (1 < lVar8);
        lVar5 = (long)ptVar1 - (long)ptVar7;
        __it._M_current = ptVar7;
      }
      lVar5 = (lVar5 >> 3) * -0x3333333333333333;
      if (lVar5 == 1) {
LAB_00116449:
        bVar3 = __gnu_cxx::__ops::
                _Iter_pred<InitSocket::NotifyOnAddressChanges(std::vector<std::tuple<std::__cxx11::string,int,int>,std::allocator<std::tuple<std::__cxx11::string,int,int>>>&)::$_0>
                ::operator()((_Iter_pred<InitSocket::NotifyOnAddressChanges(std::vector<std::tuple<std::__cxx11::string,int,int>,std::allocator<std::tuple<std::__cxx11::string,int,int>>>&)::__0>
                              *)__position._M_current,__it);
        __position_00._M_current = __it._M_current;
        if (!bVar3) {
          __position_00._M_current = ptVar1;
        }
LAB_00116462:
        if (__position_00._M_current == ptVar1) goto LAB_0011647a;
        std::
        vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
        ::_M_erase(local_70,(iterator)__position_00._M_current);
        __position._M_current = __position._M_current + 1;
      }
      else {
        if (lVar5 == 2) {
LAB_00116436:
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<InitSocket::NotifyOnAddressChanges(std::vector<std::tuple<std::__cxx11::string,int,int>,std::allocator<std::tuple<std::__cxx11::string,int,int>>>&)::$_0>
                  ::operator()((_Iter_pred<InitSocket::NotifyOnAddressChanges(std::vector<std::tuple<std::__cxx11::string,int,int>,std::allocator<std::tuple<std::__cxx11::string,int,int>>>&)::__0>
                                *)__position._M_current,__it);
          __position_00._M_current = __it._M_current;
          if (!bVar3) {
            __it._M_current = __it._M_current + 1;
            goto LAB_00116449;
          }
          goto LAB_00116462;
        }
        if (lVar5 == 3) {
          bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<InitSocket::NotifyOnAddressChanges(std::vector<std::tuple<std::__cxx11::string,int,int>,std::allocator<std::tuple<std::__cxx11::string,int,int>>>&)::$_0>
                  ::operator()((_Iter_pred<InitSocket::NotifyOnAddressChanges(std::vector<std::tuple<std::__cxx11::string,int,int>,std::allocator<std::tuple<std::__cxx11::string,int,int>>>&)::__0>
                                *)__position._M_current,__it);
          __position_00._M_current = __it._M_current;
          if (!bVar3) {
            __it._M_current = __it._M_current + 1;
            goto LAB_00116436;
          }
          goto LAB_00116462;
        }
LAB_0011647a:
        std::
        vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
        ::push_back(&local_58,__position._M_current);
        __position = std::
                     vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
                     ::_M_erase(local_60,__position);
      }
    } while (__position._M_current !=
             (local_68->m_vCurIPAddr).
             super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  p_Var6 = (_Tuple_impl<1UL,_int,_int> *)
           (local_70->
           super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  p_Var2 = (_Tuple_impl<1UL,_int,_int> *)
           (local_70->
           super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (p_Var6 != p_Var2) {
    do {
      local_98 = *(undefined1 (*) [8])p_Var6;
      local_90._M_dataplus._M_p = local_98 + 0x18;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_98 + 8),p_Var6[1],(long)p_Var6[2] + (long)p_Var6[1]);
      std::
      vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
      ::push_back(local_60,(value_type *)local_98);
      if (local_90._M_dataplus._M_p != local_98 + 0x18) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      p_Var6 = p_Var6 + 5;
    } while (p_Var6 != p_Var2);
  }
  pthread_mutex_unlock(local_38);
  ptVar7 = local_58.
           super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((local_68->m_fnCbAddrNotify).super__Function_base._M_manager != (_Manager_type)0x0) {
    this_00 = &local_68->m_fnCbAddrNotify;
    if (local_58.
        super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_58.
        super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      p_Var6 = (_Tuple_impl<1UL,_int,_int> *)
               local_58.
               super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_98 = *(undefined1 (*) [8])p_Var6;
        local_90._M_dataplus._M_p = local_98 + 0x18;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_98 + 8),p_Var6[1],(long)p_Var6[2] + (long)p_Var6[1]);
        std::
        function<void_(bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>
        ::operator()(this_00,false,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_98 + 8),local_98._4_4_,local_98._0_4_);
        if (local_90._M_dataplus._M_p != local_98 + 0x18) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        p_Var6 = p_Var6 + 5;
      } while (p_Var6 != (_Tuple_impl<1UL,_int,_int> *)ptVar7);
    }
    p_Var6 = (_Tuple_impl<1UL,_int,_int> *)
             (local_70->
             super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    p_Var2 = (_Tuple_impl<1UL,_int,_int> *)
             (local_70->
             super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (p_Var6 != p_Var2) {
      do {
        local_98 = *(undefined1 (*) [8])p_Var6;
        local_90._M_dataplus._M_p = local_98 + 0x18;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_98 + 8),p_Var6[1],(long)p_Var6[2] + (long)p_Var6[1]);
        std::
        function<void_(bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>
        ::operator()(this_00,true,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_98 + 8),local_98._4_4_,local_98._0_4_);
        if (local_90._M_dataplus._M_p != local_98 + 0x18) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        p_Var6 = p_Var6 + 5;
      } while (p_Var6 != p_Var2);
    }
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_int>_>_>
  ::~vector(&local_58);
  return;
}

Assistant:

void InitSocket::NotifyOnAddressChanges(vector<tuple<string, int, int>>& vNewListing)
{
    vector<tuple<string, int, int>> vDelIPAddr;

    m_mxCurIpAddr.lock();
    // remove all IP addr. in the vector that where before available
    for (auto iter = begin(m_vCurIPAddr); iter != end(m_vCurIPAddr);)
    {
        auto itFound = find_if(begin(vNewListing), end(vNewListing), [iter](auto& item) { return get<0>(*iter) == get<0>(item) ? true : false; });
        if (itFound != end(vNewListing))
            vNewListing.erase(itFound);  // address existed before, so remove it from the list with our new addresses
        else
        {   // the IP does not exist any more
            vDelIPAddr.push_back(*iter);    // remember witch one was removed
            iter = m_vCurIPAddr.erase(iter);
            continue;
        }
        ++iter;
    }

    for (auto iter : vNewListing)
        m_vCurIPAddr.push_back(iter);    // remember witch one was removed

    m_mxCurIpAddr.unlock();

    if (m_fnCbAddrNotify)
    {
        // Notify on all deleted IP addresses
        for (auto iter : vDelIPAddr)
            m_fnCbAddrNotify(false, get<0>(iter), get<1>(iter), get<2>(iter));
        // Notify on all new IP addresses
        for (auto iter : vNewListing)
            m_fnCbAddrNotify(true, get<0>(iter), get<1>(iter), get<2>(iter));
    }
}